

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O0

int icount(uint v)

{
  undefined4 local_10;
  undefined4 local_c;
  int ret;
  uint v_local;
  
  local_10 = 0;
  for (local_c = v; local_c != 0; local_c = local_c >> 1) {
    local_10 = (local_c & 1) + local_10;
  }
  return local_10;
}

Assistant:

static int icount(unsigned int v){
  int ret=0;
  while(v){
    ret+=v&1;
    v>>=1;
  }
  return(ret);
}